

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1enc.c
# Opt level: O2

int jpc_enc_enccblks(jpc_enc_t *enc)

{
  uint uVar1;
  jas_matrix_t *pjVar2;
  long lVar3;
  int iVar4;
  jpc_enc_tcmpt_t *pjVar5;
  jpc_enc_rlvl_t *pjVar6;
  jpc_enc_band_t *pjVar7;
  long lVar8;
  jpc_enc_prc_t *pjVar9;
  jpc_enc_cblk_t *pjVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long x;
  long lVar16;
  long lVar17;
  jpc_enc_tcmpt_t *tcmpt;
  jpc_enc_cblk_t *pjVar18;
  jpc_enc_rlvl_t *pjVar19;
  jpc_enc_cblk_t *cblk;
  jpc_enc_band_t *band;
  
  tcmpt = enc->curtile->tcmpts;
  pjVar5 = tcmpt + enc->curtile->numtcmpts;
  do {
    if (tcmpt == pjVar5) {
      return 0;
    }
    pjVar19 = tcmpt->rlvls;
    pjVar6 = pjVar19 + tcmpt->numrlvls;
    for (; pjVar19 != pjVar6; pjVar19 = pjVar19 + 1) {
      band = pjVar19->bands;
      if (band != (jpc_enc_band_t *)0x0) {
        pjVar7 = band + pjVar19->numbands;
        for (; band != pjVar7; band = band + 1) {
          if (band->data != (jas_matrix_t *)0x0) {
            pjVar9 = band->prcs;
            for (uVar13 = 0; uVar13 < pjVar19->numprcs; uVar13 = uVar13 + 1) {
              cblk = pjVar9->cblks;
              if (cblk != (jpc_enc_cblk_t *)0x0) {
                uVar1 = pjVar9->numcblks;
                lVar14 = (ulong)uVar1 * 0x68;
                for (pjVar18 = cblk; lVar8 = lVar14, pjVar10 = cblk, pjVar18 != cblk + uVar1;
                    pjVar18 = pjVar18 + 1) {
                  pjVar2 = pjVar18->data;
                  lVar8 = pjVar2->numrows_;
                  if (pjVar2->numrows_ < 1) {
                    lVar8 = 0;
                  }
                  x = 0;
                  for (lVar12 = 0; lVar12 != lVar8; lVar12 = lVar12 + 1) {
                    lVar15 = pjVar2->numcols_;
                    if (pjVar2->numcols_ < 1) {
                      lVar15 = 0;
                    }
                    for (lVar16 = 0; lVar15 != lVar16; lVar16 = lVar16 + 1) {
                      lVar3 = pjVar2->rows_[lVar12][lVar16];
                      lVar17 = -lVar3;
                      if (0 < lVar3) {
                        lVar17 = lVar3;
                      }
                      if (x < lVar17) {
                        x = lVar17;
                      }
                    }
                  }
                  iVar4 = jpc_fix_firstone(x);
                  iVar11 = iVar4 + -5;
                  if (iVar4 < 6) {
                    iVar11 = 0;
                  }
                  pjVar18->numbps = iVar11;
                }
                while (lVar8 != 0) {
                  iVar11 = band->numbps - pjVar10->numbps;
                  pjVar10->numimsbs = iVar11;
                  lVar8 = lVar8 + -0x68;
                  pjVar10 = pjVar10 + 1;
                  if (iVar11 < 0) {
                    __assert_fail("cblk->numimsbs >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                  ,0xa1,"int jpc_enc_enccblks(jpc_enc_t *)");
                  }
                }
                while (lVar14 != 0) {
                  iVar11 = jpc_enc_enccblk(tcmpt,band,cblk);
                  cblk = cblk + 1;
                  lVar14 = lVar14 + -0x68;
                  if (iVar11 != 0) {
                    return -1;
                  }
                }
              }
              pjVar9 = pjVar9 + 1;
            }
          }
        }
      }
    }
    tcmpt = tcmpt + 1;
  } while( true );
}

Assistant:

int jpc_enc_enccblks(jpc_enc_t *enc)
{
	jpc_enc_tcmpt_t *tcmpt;
	jpc_enc_tcmpt_t *endcomps;
	jpc_enc_rlvl_t *lvl;
	jpc_enc_rlvl_t *endlvls;
	jpc_enc_band_t *band;
	jpc_enc_band_t *endbands;
	jpc_enc_cblk_t *cblk;
	jpc_enc_cblk_t *endcblks;
	jpc_fix_t mx;
	jpc_fix_t bmx;
	jpc_fix_t v;
	jpc_enc_tile_t *tile;
	uint_fast32_t prcno;
	jpc_enc_prc_t *prc;

	tile = enc->curtile;

	endcomps = &tile->tcmpts[tile->numtcmpts];
	for (tcmpt = tile->tcmpts; tcmpt != endcomps; ++tcmpt) {
		endlvls = &tcmpt->rlvls[tcmpt->numrlvls];
		for (lvl = tcmpt->rlvls; lvl != endlvls; ++lvl) {
			if (!lvl->bands) {
				continue;
			}
			endbands = &lvl->bands[lvl->numbands];
			for (band = lvl->bands; band != endbands; ++band) {
				if (!band->data) {
					continue;
				}
				for (prcno = 0, prc = band->prcs; prcno < lvl->numprcs; ++prcno, ++prc) {
					if (!prc->cblks) {
						continue;
					}
					bmx = 0;
					endcblks = &prc->cblks[prc->numcblks];
					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						mx = 0;
						for (jas_matind_t i = 0; i < jas_matrix_numrows(cblk->data); ++i) {
							for (jas_matind_t j = 0; j < jas_matrix_numcols(cblk->data); ++j) {
								v = JAS_ABS(jas_matrix_get(cblk->data, i, j));
								if (v > mx) {
									mx = v;
								}
							}
						}
						if (mx > bmx) {
							bmx = mx;
						}
						cblk->numbps = JAS_MAX(jpc_fix_firstone(mx) + 1 - JPC_NUMEXTRABITS, 0);
					}

					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						cblk->numimsbs = band->numbps - cblk->numbps;
						assert(cblk->numimsbs >= 0);
					}

					for (cblk = prc->cblks; cblk != endcblks; ++cblk) {
						if (jpc_enc_enccblk(tcmpt, band, cblk)) {
							return -1;
						}
					}
				}
			}
		}
	}
	return 0;
}